

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.hpp
# Opt level: O2

void baryonyx::info<std::__cxx11::string>
               (context *ctx,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg1)

{
  if (5 < (int)ctx->log_priority) {
    log<std::__cxx11::string>(_stdout,6,fmt,arg1);
    return;
  }
  return;
}

Assistant:

inline bool
is_loggable(context::message_type current_level, int level) noexcept
{
    return static_cast<int>(current_level) >= level;
}